

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_file.cpp
# Opt level: O0

I32 Omega_h::binary::read_nparts(path *path,CommPtr *comm)

{
  byte bVar1;
  I32 IVar2;
  element_type *peVar3;
  value_type_conflict *pvVar4;
  long local_278;
  ifstream file;
  path local_60;
  undefined1 local_40 [8];
  path filepath;
  I32 nparts;
  CommPtr *comm_local;
  path *path_local;
  
  peVar3 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)comm);
  IVar2 = Comm::rank(peVar3);
  if (IVar2 == 0) {
    filesystem::path::path(&local_60,"nparts");
    filesystem::operator/((path *)local_40,path,&local_60);
    filesystem::path::~path(&local_60);
    pvVar4 = filesystem::path::c_str((path *)local_40);
    std::ifstream::ifstream(&local_278,pvVar4,_S_in);
    bVar1 = std::ifstream::is_open();
    if ((bVar1 & 1) == 0) {
      pvVar4 = filesystem::path::c_str((path *)local_40);
      fail("could not open file \"%s\"\n",pvVar4);
    }
    std::istream::operator>>(&local_278,(int *)&filepath.field_0x1c);
    bVar1 = std::ios::operator!((void *)((long)&local_278 + *(long *)(local_278 + -0x18)));
    if ((bVar1 & 1) != 0) {
      pvVar4 = filesystem::path::c_str((path *)local_40);
      fail("could not read file \"%s\"\n",pvVar4);
    }
    std::ifstream::~ifstream(&local_278);
    filesystem::path::~path((path *)local_40);
  }
  peVar3 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)comm);
  Comm::bcast<int>(peVar3,(int *)&filepath.field_0x1c,0);
  return filepath._28_4_;
}

Assistant:

I32 read_nparts(filesystem::path const& path, CommPtr comm) {
  I32 nparts;
  if (comm->rank() == 0) {
    auto const filepath = path / "nparts";
    std::ifstream file(filepath.c_str());
    if (!file.is_open()) {
      Omega_h_fail("could not open file \"%s\"\n", filepath.c_str());
    }
    file >> nparts;
    if (!file) {
      Omega_h_fail("could not read file \"%s\"\n", filepath.c_str());
    }
  }
  comm->bcast(nparts);
  return nparts;
}